

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O2

TPZCompElSide __thiscall TPZCheckMesh::FindElement(TPZCheckMesh *this,int connect)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  TPZCompEl **ppTVar5;
  TPZInterpolatedElement *this_00;
  TPZGeoEl *pTVar6;
  int64_t iVar7;
  ulong nelem;
  int in_EDX;
  undefined4 in_register_00000034;
  int side;
  int connect_00;
  TPZCompElSide TVar8;
  TPZCompMesh *local_58;
  
  uVar1 = *(uint *)(*(long *)CONCAT44(in_register_00000034,connect) + 0x48);
  nelem = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = nelem;
  }
  for (; nelem != uVar4; nelem = nelem + 1) {
    ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        ((TPZChunkVector<TPZCompEl_*,_10> *)
                         (*(long *)CONCAT44(in_register_00000034,connect) + 0x40),nelem);
    local_58 = (TPZCompMesh *)*ppTVar5;
    if (local_58 != (TPZCompMesh *)0x0) {
      side = 0;
      this_00 = (TPZInterpolatedElement *)
                __dynamic_cast(local_58,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,0);
      pTVar6 = TPZCompEl::Reference((TPZCompEl *)local_58);
      iVar2 = (**(code **)(*(long *)pTVar6 + 0xf0))(pTVar6);
      if (iVar2 < 1) {
        iVar2 = side;
      }
      for (; side != iVar2; side = side + 1) {
        iVar3 = (**(code **)(*(long *)&(this_00->super_TPZInterpolationSpace).super_TPZCompEl +
                            0x248))(this_00,side);
        connect_00 = 0;
        if (iVar3 < 1) {
          iVar3 = connect_00;
        }
        while (iVar3 != connect_00) {
          iVar7 = TPZInterpolatedElement::SideConnectIndex(this_00,connect_00,side);
          connect_00 = connect_00 + 1;
          if (iVar7 == in_EDX) goto LAB_00ff750f;
        }
      }
    }
  }
  local_58 = (TPZCompMesh *)0x0;
  side = -1;
LAB_00ff750f:
  this->fMesh = local_58;
  *(int *)&this->fOut = side;
  TVar8._8_8_ = local_58;
  TVar8.fEl = (TPZCompEl *)this;
  return TVar8;
}

Assistant:

TPZCompElSide TPZCheckMesh::FindElement(int connect) {
	int nelem = fMesh->ElementVec().NElements();
	int el;
	for(el=0; el<nelem; el++) {
		TPZCompEl *cel = fMesh->ElementVec()[el];
		if(!cel) continue;
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(cel);
        TPZGeoEl *gel = cel->Reference();
        int ns = gel->NSides();
		
		for(int side=0; side<ns; side++) {
            int nsc = intel->NSideConnects(side);
            for (int ic=0; ic<nsc; ic++)
            {
                int64_t index = intel->SideConnectIndex(ic, side);
                if(index == connect) {
                    return TPZCompElSide(cel,side);
                }
			}
		}
	}
	TPZCompElSide nullside;
	return nullside;
}